

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.cc
# Opt level: O0

void __thiscall
MemoryState::getChunk(MemoryState *this,uint1 *res,AddrSpace *spc,uintb off,int4 size)

{
  LowlevelError *this_00;
  string local_58 [32];
  MemoryBank *local_38;
  MemoryBank *mspace;
  uintb uStack_28;
  int4 size_local;
  uintb off_local;
  AddrSpace *spc_local;
  uint1 *res_local;
  MemoryState *this_local;
  
  mspace._4_4_ = size;
  uStack_28 = off;
  off_local = (uintb)spc;
  spc_local = (AddrSpace *)res;
  res_local = (uint1 *)this;
  local_38 = getMemoryBank(this,spc);
  if (local_38 == (MemoryBank *)0x0) {
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    AddrSpace::getName_abi_cxx11_((AddrSpace *)off_local);
    std::operator+((char *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Getting chunk from unmapped memory space: ");
    LowlevelError::LowlevelError(this_00,local_58);
    __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  MemoryBank::getChunk(local_38,uStack_28,mspace._4_4_,(uint1 *)spc_local);
  return;
}

Assistant:

void MemoryState::getChunk(uint1 *res,AddrSpace *spc,uintb off,int4 size) const

{
  MemoryBank *mspace = getMemoryBank(spc);
  if (mspace == (MemoryBank *)0)
    throw LowlevelError("Getting chunk from unmapped memory space: "+spc->getName());
  mspace->getChunk(off,size,res);
}